

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O3

XMLNode * __thiscall
ORPG::Core::XMLNode::insert_before_node(XMLNode *this,XMLNode *before,XMLNode *insert)

{
  XMLNode *pXVar1;
  
  if (((before != (XMLNode *)0x0 && insert != (XMLNode *)0x0) &&
      (insert->document == this->document)) && (before->document == insert->document)) {
    if (before->nextSib != (XMLNode *)0x0) {
      pXVar1 = before->prevSib;
      before->prevSib = insert;
      insert->prevSib = pXVar1;
      return insert;
    }
    before->nextSib = insert;
    return insert;
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLNode::insert_before_node(XMLNode* before, XMLNode* insert) {
    if(insert == nullptr) return 0;
    if(before == nullptr) return 0;

    if(insert->get_document() != this->get_document()) return 0;
    if(before->get_document() != this->get_document()) return 0;

    if(before->nextSib == nullptr) {
        before->nextSib = insert;
    } else {
        //TODO Query to ensure the node doesn't already exist
        //Create a temporary pointer to help with the insert
        XMLNode* tmp = before->prevSib;
        before->prevSib = insert;
        insert->prevSib = tmp;
    }

    return insert;
}